

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  ulong uVar1;
  size_t slotIndex;
  anon_struct_16_2_1636864c gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_50;
  undefined8 local_40;
  sysbvm_stackFrameRecord_t local_38;
  undefined8 local_28;
  undefined1 *local_20;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_68 = 0;
  sStack_60 = 0;
  local_38.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_38.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_38._12_4_ = 0;
  local_28 = 2;
  local_20 = (undefined1 *)&local_68;
  sysbvm_stackFrame_pushRecord(&local_38);
  local_50.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_50.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  local_40 = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord(&local_50);
  local_68 = sysbvm_interpreter_evaluateASTWithEnvironment
                       (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  uVar1 = *(ulong *)(*arguments + 0x38);
  if ((uVar1 & 0xf) == 0 && uVar1 != 0) {
    uVar1 = *(ulong *)(uVar1 + 0x48);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      slotIndex = (long)uVar1 >> 4;
    }
    else {
      slotIndex = *(size_t *)(uVar1 + 0x10);
    }
  }
  else {
    slotIndex = 0;
  }
  sStack_60 = sysbvm_tuple_slotAt(context,local_68,slotIndex);
  sysbvm_stackFrame_popRecord(&local_50);
  sysbvm_stackFrame_popRecord(&local_38);
  return sStack_60;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedAtNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_astTupleSlotNamedAtNode_t **node = (sysbvm_astTupleSlotNamedAtNode_t**)&arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_tuple_t tuple;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*node)->super.sourcePosition);

    gcFrame.tuple = sysbvm_interpreter_evaluateASTWithEnvironment(context, (*node)->tupleExpression, *environment);
    size_t slotIndex = sysbvm_typeSlot_getIndex((*node)->boundSlot);
    gcFrame.result = sysbvm_tuple_slotAt(context, gcFrame.tuple, slotIndex);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);

    return gcFrame.result;
}